

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

String * __thiscall
Json::valueToQuotedStringN_abi_cxx11_
          (String *__return_storage_ptr__,Json *this,char *value,uint length,bool emitUTF8)

{
  Json *pJVar1;
  Json JVar2;
  long lVar3;
  uint uVar4;
  long *plVar5;
  size_type *psVar6;
  uint x;
  uint x_00;
  uint x_01;
  Json *pJVar7;
  uint uVar8;
  Json *pJVar9;
  bool bVar10;
  String local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (this == (Json *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pJVar7 = this + ((ulong)value & 0xffffffff);
    bVar10 = (int)value != 0;
    pJVar9 = this;
    if (bVar10) {
      do {
        JVar2 = *pJVar9;
        if (((JVar2 == (Json)0x22) || (JVar2 == (Json)0x5c)) || ((char)JVar2 < ' ')) break;
        bVar10 = pJVar9 + 1 < pJVar7;
        pJVar9 = pJVar9 + 1;
      } while (bVar10);
    }
    if (bVar10) {
      local_58 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((int)value != 0) {
        do {
          JVar2 = *this;
          pJVar9 = (Json *)(ulong)(byte)JVar2;
          switch(JVar2) {
          case (Json)0x8:
            break;
          case (Json)0x9:
            break;
          case (Json)0xa:
            break;
          case (Json)0xb:
switchD_00112e96_caseD_b:
            if ((char)length == '\0') {
              if ((char)JVar2 < '\0') {
                if ((byte)JVar2 < 0xe0) {
                  if (1 < (long)pJVar7 - (long)this) {
                    uVar8 = ((byte)JVar2 & 0x1f) << 6;
                    pJVar9 = this + 1;
                    this = this + 1;
                    uVar4 = (byte)*pJVar9 & 0x3f | uVar8;
                    if (uVar8 < 0x80) {
                      uVar4 = 0xfffd;
                    }
                    pJVar9 = (Json *)(ulong)uVar4;
                    goto LAB_00113001;
                  }
                }
                else if ((byte)JVar2 < 0xf0) {
                  if (2 < (long)pJVar7 - (long)this) {
                    uVar8 = ((byte)JVar2 & 0xf) << 0xc;
                    uVar4 = ((byte)this[1] & 0x3f) << 6 | uVar8;
                    this = this + 2;
                    if ((0xdfff < uVar8) || (uVar4 < 0xd800)) {
                      uVar8 = (byte)*this & 0x3f | uVar4;
                      bVar10 = uVar4 < 0x800;
                      goto LAB_00112ff8;
                    }
                  }
                }
                else if (3 < (long)pJVar7 - (long)this && (byte)JVar2 < 0xf8) {
                  uVar4 = ((byte)this[1] & 0x3f) << 0xc | ((byte)JVar2 & 7) << 0x12;
                  pJVar9 = this + 2;
                  pJVar1 = this + 3;
                  this = this + 3;
                  uVar8 = (byte)*pJVar1 & 0x3f | ((byte)*pJVar9 & 0x3f) << 6 | uVar4;
                  bVar10 = uVar4 < 0x10000;
LAB_00112ff8:
                  pJVar9 = (Json *)(ulong)uVar8;
                  if (bVar10) {
                    pJVar9 = (Json *)0xfffd;
                  }
                  goto LAB_00113001;
                }
                pJVar9 = (Json *)0xfffd;
              }
LAB_00113001:
              uVar4 = (uint)pJVar9;
              if (uVar4 - 0x20 < 0x60) {
                std::__cxx11::string::push_back((char)__return_storage_ptr__);
              }
              else {
                if (uVar4 < 0x10000) {
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  toHex16Bit_abi_cxx11_(&local_78,pJVar9,x);
                  std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
                }
                else {
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  toHex16Bit_abi_cxx11_
                            (&local_78,(Json *)(ulong)((uVar4 - 0x10000 >> 10) + 0xd800),x_00);
                  std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_78._M_dataplus._M_p != &local_78.field_2) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  toHex16Bit_abi_cxx11_(&local_78,(Json *)(ulong)(uVar4 & 0x3ff | 0xdc00),x_01);
                  std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
            }
            goto LAB_00112efa;
          case (Json)0xc:
            break;
          case (Json)0xd:
            break;
          default:
            if ((JVar2 != (Json)0x5c) && (JVar2 != (Json)0x22)) goto switchD_00112e96_caseD_b;
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00112efa:
          this = this + 1;
        } while (this != pJVar7);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"\"","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
      psVar6 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_78.field_2._M_allocated_capacity = *psVar6;
        local_78.field_2._8_8_ = plVar5[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *psVar6;
        local_78._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_78._M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar6 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar6) {
        lVar3 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static String valueToQuotedStringN(const char* value, unsigned length,
                                   bool emitUTF8 = false) {
  if (value == nullptr)
    return "";

  if (!isAnyCharRequiredQuoting(value, length))
    return String("\"") + value + "\"";
  // We have to walk value and escape any special characters.
  // Appending to String is not efficient, but this should be rare.
  // (Note: forward slashes are *not* rare, but I am not escaping them.)
  String::size_type maxsize = length * 2 + 3; // allescaped+quotes+NULL
  String result;
  result.reserve(maxsize); // to avoid lots of mallocs
  result += "\"";
  char const* end = value + length;
  for (const char* c = value; c != end; ++c) {
    switch (*c) {
    case '\"':
      result += "\\\"";
      break;
    case '\\':
      result += "\\\\";
      break;
    case '\b':
      result += "\\b";
      break;
    case '\f':
      result += "\\f";
      break;
    case '\n':
      result += "\\n";
      break;
    case '\r':
      result += "\\r";
      break;
    case '\t':
      result += "\\t";
      break;
    // case '/':
    // Even though \/ is considered a legal escape in JSON, a bare
    // slash is also legal, so I see no reason to escape it.
    // (I hope I am not misunderstanding something.)
    // blep notes: actually escaping \/ may be useful in javascript to avoid </
    // sequence.
    // Should add a flag to allow this compatibility mode and prevent this
    // sequence from occurring.
    default: {
      if (emitUTF8) {
        result += *c;
      } else {
        unsigned int codepoint = utf8ToCodepoint(c, end);
        const unsigned int FIRST_NON_CONTROL_CODEPOINT = 0x20;
        const unsigned int LAST_NON_CONTROL_CODEPOINT = 0x7F;
        const unsigned int FIRST_SURROGATE_PAIR_CODEPOINT = 0x10000;
        // don't escape non-control characters
        // (short escape sequence are applied above)
        if (FIRST_NON_CONTROL_CODEPOINT <= codepoint &&
            codepoint <= LAST_NON_CONTROL_CODEPOINT) {
          result += static_cast<char>(codepoint);
        } else if (codepoint <
                   FIRST_SURROGATE_PAIR_CODEPOINT) { // codepoint is in Basic
                                                     // Multilingual Plane
          result += "\\u";
          result += toHex16Bit(codepoint);
        } else { // codepoint is not in Basic Multilingual Plane
                 // convert to surrogate pair first
          codepoint -= FIRST_SURROGATE_PAIR_CODEPOINT;
          result += "\\u";
          result += toHex16Bit((codepoint >> 10) + 0xD800);
          result += "\\u";
          result += toHex16Bit((codepoint & 0x3FF) + 0xDC00);
        }
      }
    } break;
    }
  }
  result += "\"";
  return result;
}